

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O2

bool __thiscall
SVGChart::LineDataDrawer::DrawData
          (LineDataDrawer *this,PlotDataBase *inXData,PlotDataBase *inYData,
          PlotDataSelection *inPlotDataSelection,AxisSetup *inXAxisSetup,PRect *inRect,
          Painter *inPainter)

{
  pointer piVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  undefined4 extraout_var;
  uint uVar8;
  bool bVar9;
  Trafo *pTVar10;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float fVar11;
  float local_80;
  long local_78;
  long theEnd;
  long theStart;
  
  if (((((this->super_DataDrawerBase).mXTrafo != (Trafo *)0x0) &&
       ((this->super_DataDrawerBase).mYTrafo != (Trafo *)0x0)) &&
      (lVar6 = PlotDataBase::GetSize(inXData), lVar6 != 0)) &&
     (lVar6 = PlotDataBase::GetSize(inYData), lVar6 != 0)) {
    lVar6 = PlotDataBase::GetSize(inXData);
    lVar7 = PlotDataBase::GetSize(inYData);
    if (lVar6 <= lVar7) {
      (*inPainter->_vptr_Painter[0xc])(inPainter,&this->mStyle);
      theStart = 0;
      local_78 = PlotDataBase::GetSize(inXData);
      local_78 = local_78 + -1;
      theEnd = local_78;
      if ((this->super_DataDrawerBase).mDrawFast == true) {
        FindRange(inXData,inXAxisSetup->mMin,inXAxisSetup->mMax,&theStart,&theEnd);
        lVar6 = theStart;
        local_78 = theEnd;
        lVar7 = theEnd - theStart;
        iVar3 = (*inPainter->_vptr_Painter[4])(inPainter);
        uVar4 = (uint)((lVar7 + 1) / CONCAT44(extraout_var,iVar3));
        uVar8 = 1;
        if (1 < uVar4) {
          uVar8 = uVar4;
        }
        lVar6 = (long)(int)lVar6;
      }
      else {
        uVar8 = 1;
        lVar6 = 0;
      }
      iVar3 = uVar8 + (int)lVar6 + -1;
      bVar9 = true;
      local_80 = 0.0;
      fVar11 = 0.0;
      while( true ) {
        bVar2 = local_78 < lVar6;
        if (local_78 < lVar6) {
          return bVar2;
        }
        pTVar10 = (this->super_DataDrawerBase).mXTrafo;
        PlotDataBase::GetValue(inXData,lVar6);
        (*pTVar10->_vptr_Trafo[2])(pTVar10);
        if ((int)uVar8 < 2) {
          pTVar10 = (this->super_DataDrawerBase).mYTrafo;
          PlotDataBase::GetValue(inYData,lVar6);
        }
        else {
          lVar7 = (long)iVar3;
          if (local_78 < iVar3) {
            lVar7 = local_78;
          }
          pTVar10 = (this->super_DataDrawerBase).mYTrafo;
          GetMaxFromRange(inYData,lVar6,lVar7);
        }
        (*pTVar10->_vptr_Trafo[2])(pTVar10);
        if ((!bVar9) && ((this->super_DataDrawerBase).field_0x24 == '\x01')) {
          (**inPainter->_vptr_Painter)(local_80,fVar11,extraout_XMM0_Da,extraout_XMM0_Da_00);
        }
        if (((this->super_DataDrawerBase).field_0x25 == '\x01') &&
           (iVar5 = (*(this->super_DataDrawerBase)._vptr_DataDrawerBase[4])
                              (this,(ulong)(uint)(int)extraout_XMM0_Da,
                               (ulong)(uint)(int)extraout_XMM0_Da_00,inRect,inPainter),
           (char)iVar5 == '\0')) break;
        piVar1 = (inPlotDataSelection->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        if (((lVar6 < (long)(inPlotDataSelection->super_vector<int,_std::allocator<int>_>).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar1 >> 2) &&
            (0 < piVar1[lVar6])) &&
           (iVar5 = (*(this->super_DataDrawerBase)._vptr_DataDrawerBase[5])
                              (this,(ulong)(uint)(int)extraout_XMM0_Da,
                               (ulong)(uint)(int)extraout_XMM0_Da_00,inRect,inPainter),
           (char)iVar5 == '\0')) {
          return bVar2;
        }
        lVar6 = lVar6 + (int)uVar8;
        iVar3 = iVar3 + uVar8;
        bVar9 = false;
        fVar11 = extraout_XMM0_Da_00;
        local_80 = extraout_XMM0_Da;
      }
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool LineDataDrawer::DrawData (const PlotDataBase &inXData, const PlotDataBase &inYData, const PlotDataSelection &inPlotDataSelection, const AxisSetup &inXAxisSetup, const PRect &inRect, Painter &inPainter) const {
      if (!mXTrafo || !mYTrafo) {
        return false;
      }
      if ((inXData.GetSize () == 0) || (inYData.GetSize () == 0)) {
          return false;
      }
      long theXSize = inXData.GetSize ();
      long theYSize = inYData.GetSize ();
      if (theXSize>theYSize) {
        return false;
      }
      inPainter.SetStyle (mStyle);
      float thePrevX = 0;
      float thePrevY = 0;
      bool theFirst = true;
      float theTraX, theTraY;

      long theStart = 0;
      long theEnd = inXData.GetSize () - 1;
      int theStride = 1;
      if (mDrawFast) {
          FindRange (inXData, inXAxisSetup.mMin, inXAxisSetup.mMax, theStart, theEnd);

          theStride = (theEnd - theStart + 1) / inPainter.GetWidth ();
          if (theStride == 0) {
              theStride = 1;
          }
      }


      for (int theI = theStart; theI <= theEnd; theI+=theStride) {

        theTraX = mXTrafo->Transform (inXData.GetValue (theI));
        if (theStride > 1) {
          long theLast = theI + theStride - 1;
          if (theLast>theEnd) {
            theLast = theEnd;
          }
            theTraY = mYTrafo->Transform (GetMaxFromRange (inYData, theI, theLast));
        }
        else {
            theTraY = mYTrafo->Transform (inYData.GetValue (theI));
        }

        if (!theFirst && mDrawLine) {
          inPainter.DrawLine (thePrevX, thePrevY, theTraX, theTraY);
        }
        else {
          theFirst = false;
        }
        bool theDrawPoint = mDrawPoint;

        if (theDrawPoint && !DrawPoint (theTraX, theTraY, inRect, inPainter)) {
          return false;
        }
        if (inPlotDataSelection.IsSelected (theI) && !DrawSelection (theTraX, theTraY, inRect, inPainter)) {
          return false;
        }
        thePrevX = theTraX;
        thePrevY = theTraY;
      }
      return true;
    }